

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# happly.h
# Opt level: O2

vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
* __thiscall
happly::Element::getDataFromListPropertyRecursive<unsigned_long,signed_char>
          (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
           *__return_storage_ptr__,Element *this,Property *prop)

{
  char *pcVar1;
  long lVar2;
  runtime_error *this_00;
  Tcan *v;
  char *pcVar3;
  vector<unsigned_long,_std::allocator<unsigned_long>_> castedFlatVecCopy;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_108;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (prop != (Property *)0x0) {
    lVar2 = __dynamic_cast(prop,&Property::typeinfo,&TypedListProperty<signed_char>::typeinfo,0);
    if (lVar2 != 0) {
      castedFlatVecCopy.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      castedFlatVecCopy.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      castedFlatVecCopy.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      geometrycentral::surface::std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&castedFlatVecCopy,
                 *(long *)(lVar2 + 0x30) - *(long *)(lVar2 + 0x28));
      pcVar1 = *(char **)(lVar2 + 0x30);
      for (pcVar3 = *(char **)(lVar2 + 0x28); pcVar3 != pcVar1; pcVar3 = pcVar3 + 1) {
        local_f0._M_dataplus._M_p = (pointer)(long)*pcVar3;
        std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                  (&castedFlatVecCopy,(unsigned_long *)&local_f0);
      }
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_108,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)(lVar2 + 0x40));
      anon_unknown_3::unflattenList<unsigned_long>
                (__return_storage_ptr__,&castedFlatVecCopy,
                 (vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_108);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_108);
      std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
                (&castedFlatVecCopy.
                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
      return __return_storage_ptr__;
    }
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_90,"PLY parser: list property ",&prop->name);
  std::operator+(&local_70,&local_90," cannot be coerced to requested type list ");
  typeName<unsigned_long>();
  std::operator+(&local_50,&local_70,&local_b0);
  std::operator+(&local_f0,&local_50,". Has type list ");
  (*prop->_vptr_Property[0xb])(&local_d0,prop);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &castedFlatVecCopy,&local_f0,&local_d0);
  std::runtime_error::runtime_error(this_00,(string *)&castedFlatVecCopy);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<std::vector<D>> getDataFromListPropertyRecursive(Property* prop) {
    typedef typename CanonicalName<T>::type Tcan;

    TypedListProperty<Tcan>* castedProp = dynamic_cast<TypedListProperty<Tcan>*>(prop);
    if (castedProp) {
      // Succeeded, return a buffer of the data (copy while converting type)

      // Convert to flat buffer of new type
      std::vector<D>* castedFlatVec = nullptr;
      std::vector<D> castedFlatVecCopy; // we _might_ make a copy here, depending on is_same below

      if (std::is_same<std::vector<D>, std::vector<Tcan>>::value) {
        // just use the array we already have
        castedFlatVec = addressIfSame<std::vector<D>>(castedProp->flattenedData, 0 /* dummy arg to disambiguate */);
      } else {
        // make a copy
        castedFlatVecCopy.reserve(castedProp->flattenedData.size());
        for (Tcan& v : castedProp->flattenedData) {
          castedFlatVecCopy.push_back(static_cast<D>(v));
        }
        castedFlatVec = &castedFlatVecCopy;
      }

      // Unflatten and return
      return unflattenList(*castedFlatVec, castedProp->flattenedIndexStart);
    }

    TypeChain<Tcan> chainType;
    if (chainType.hasChildType) {
      return getDataFromListPropertyRecursive<D, typename TypeChain<Tcan>::type>(prop);
    } else {
      // No smaller type to try, failure
      throw std::runtime_error("PLY parser: list property " + prop->name +
                               " cannot be coerced to requested type list " + typeName<D>() + ". Has type list " +
                               prop->propertyTypeName());
    }
  }